

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O3

bool __thiscall
imrt::EvaluationFunction::Zupdate
          (EvaluationFunction *this,int angle,int b,double delta_intensity,bool return_if_unfeasible
          ,vector<double,_std::allocator<double>_> *Zmax)

{
  size_t *psVar1;
  double *pdVar2;
  double dVar3;
  int iVar5;
  long lVar6;
  _Base_ptr p_Var7;
  iterator iVar8;
  Matrix *pMVar9;
  _List_node_base *p_Var10;
  _Base_ptr p_Var11;
  undefined8 uVar12;
  bool bVar13;
  long lVar14;
  double dVar15;
  _List_node_base *p_Var16;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  voxels;
  key_type local_68;
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  local_60;
  double dVar4;
  
  local_68.second = b;
  local_68.first = angle;
  iVar8 = std::
          _Hashtable<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->beamlet2voxel_list)._M_h,&local_68);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    uVar12 = std::__throw_out_of_range("_Map_base::at");
    std::
    _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
    ::~_Rb_tree(&local_60);
    _Unwind_Resume(uVar12);
  }
  std::
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
              *)((long)iVar8.
                       super__Node_iterator_base<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_true>
                       ._M_cur + 0x10));
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_60._M_impl.super__Rb_tree_header) {
    bVar13 = true;
  }
  else {
    bVar13 = true;
    p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      iVar5 = *(int *)&p_Var11[1]._M_parent;
      p_Var7 = p_Var11[1]._M_parent;
      lVar14 = (long)*(int *)((long)&p_Var11[1]._M_parent + 4);
      pMVar9 = Volume::getDepositionMatrix
                         ((this->volumes->
                          super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
                          super__Vector_impl_data._M_start + iVar5,angle);
      p_Var16 = (_List_node_base *)(pMVar9->p[lVar14][b] * delta_intensity);
      if (((double)p_Var16 != 0.0) || (NAN((double)p_Var16))) {
        lVar6 = *(long *)&(this->Z).
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar5].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        dVar15 = *(double *)(lVar6 + lVar14 * 8) + (double)p_Var16;
        pdVar2 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + iVar5;
        dVar3 = *pdVar2;
        dVar4 = *pdVar2;
        if (return_if_unfeasible &&
            ((!NAN(dVar15) && !NAN(*pdVar2)) && (dVar15 >= dVar4 && dVar15 != dVar3))) {
          bVar13 = false;
          break;
        }
        *(double *)(lVar6 + lVar14 * 8) = dVar15;
        p_Var10 = (_List_node_base *)operator_new(0x20);
        bVar13 = (bool)(bVar13 & (dVar15 < dVar4 || dVar15 == dVar3));
        p_Var10[1]._M_next = (_List_node_base *)p_Var7;
        p_Var10[1]._M_prev = p_Var16;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        psVar1 = &(this->Z_diff).
                  super__List_base<std::pair<std::pair<int,_int>,_double>,_std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  ::~_Rb_tree(&local_60);
  return bVar13;
}

Assistant:

bool EvaluationFunction::Zupdate(int angle, int b, double delta_intensity, bool return_if_unfeasible,
			vector<double>& Zmax){

	multimap<double, pair<int,int> > voxels = beamlet2voxel_list.at(make_pair(angle,b));
	bool feasible = true;
	 for(auto voxel:voxels){
		 int o=voxel.second.first, k=voxel.second.second;
		 const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
		 double delta = Dep(k,b)*(delta_intensity);
		 if(delta==0.0) continue;

		 if(Z[o][k] + delta > Zmax[o]){
			 feasible=false;
			 if(return_if_unfeasible) return feasible;
		 }

		 Z[o][k] += delta;
		 Z_diff.push_back(make_pair(make_pair(o,k),delta));
	 }

	 return feasible;
}